

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_enc_dec.cpp
# Opt level: O2

int getESICnt(string *esiStr)

{
  istream *piVar1;
  int iVar2;
  string num;
  istringstream ss;
  
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)esiStr,_S_in);
  num._M_dataplus._M_p = (pointer)&num.field_2;
  num._M_string_length = 0;
  num.field_2._M_local_buf[0] = '\0';
  iVar2 = 0;
  while( true ) {
    piVar1 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&num,',');
    if (((byte)piVar1[*(long *)(*(long *)piVar1 + -0x18) + 0x20] & 5) != 0) break;
    iVar2 = iVar2 + 1;
  }
  std::__cxx11::string::~string((string *)&num);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  return iVar2;
}

Assistant:

int getESICnt (string esiStr) {

    istringstream ss(esiStr);
    int esiCnt = 0;
    string num;
    while (getline(ss, num, ',')) {
        esiCnt++;
    }

    return esiCnt;

}